

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat64x2Operation::OpReciprocalSqrt(SIMDValue *value)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  undefined1 auVar2 [16];
  
  auVar2 = divpd(_DAT_0111d560,(undefined1  [16])value->field_0);
  aVar1.i32 = (Type  [4])sqrtpd(value->field_0,auVar2);
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpReciprocalSqrt(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue doubleOnes, temp;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        doubleOnes.m128d_value = _mm_set_pd(1.0, 1.0);
        temp.m128d_value = _mm_div_pd(doubleOnes.m128d_value, v.m128d_value); // temp = 1.0/value
        x86Result.m128d_value = _mm_sqrt_pd(temp.m128d_value); // result = sqrt(1.0/value)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }